

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_engraved_label.cxx
# Opt level: O0

void innards(Fl_Label *o,int X,int Y,int W,int H,Fl_Align align,int (*data) [3],int n)

{
  Fl_Color local_30;
  int local_2c;
  Fl_Align local_28;
  int i;
  Fl_Align a1;
  Fl_Align align_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Label *o_local;
  
  local_28 = align;
  if ((align & 0x40) != 0) {
    fl_push_clip(X,Y,W,H);
    local_28 = align & 0xffffffbf;
  }
  fl_font(o->font,o->size);
  for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
    if (local_2c < n + -1) {
      local_30 = data[local_2c][2];
    }
    else {
      local_30 = o->color;
    }
    fl_color(local_30);
    fl_draw(o->value,X + data[local_2c][0],Y + data[local_2c][1],W,H,local_28,(Fl_Image *)0x0,1);
  }
  if ((align & 0x40) != 0) {
    fl_pop_clip();
  }
  return;
}

Assistant:

static void innards(
    const Fl_Label* o, int X, int Y, int W, int H, Fl_Align align,
    const int data[][3], int n)
{
  Fl_Align a1 = align;
  if (a1 & FL_ALIGN_CLIP) {
    fl_push_clip(X, Y, W, H); a1 = (Fl_Align)(a1&~FL_ALIGN_CLIP);}
  fl_font((Fl_Font)o->font, o->size);
  for (int i = 0; i < n; i++) {
    fl_color((Fl_Color)(i < n-1 ? data[i][2] : o->color));
    fl_draw(o->value, X+data[i][0], Y+data[i][1], W, H, a1);
  }
  if (align & FL_ALIGN_CLIP) fl_pop_clip();
}